

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

void DL::Expressions::print_val(Data *d,stringstream *stream)

{
  DataGroup *this;
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  size_t sVar5;
  vector_t<Data> *pvVar6;
  ostream *poVar7;
  ulong uVar8;
  char *pcVar9;
  pointer d_00;
  Data x;
  Data local_90;
  
  switch(d->mType) {
  case DT_Group:
    this = &d->mGroup;
    bVar4 = DataGroup::isArray(this);
    poVar1 = (ostream *)(stream + 0x10);
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
      if (d->mType != DT_Group) goto LAB_00110a40;
      DataGroup::id_abi_cxx11_(&local_90.mKey,this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_90.mKey._M_dataplus._M_p,local_90.mKey._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.mKey._M_dataplus._M_p != &local_90.mKey.field_2) {
        operator_delete(local_90.mKey._M_dataplus._M_p,
                        local_90.mKey.field_2._M_allocated_capacity + 1);
      }
    }
    if (d->mType == DT_Group) {
      uVar8 = 0;
      do {
        sVar5 = DataGroup::anonymousCount(this);
        if (sVar5 <= uVar8) {
          if (d->mType != DT_Group) break;
          sVar5 = DataGroup::anonymousCount(this);
          if (sVar5 != 0) {
            if (d->mType != DT_Group) break;
            pvVar6 = DataGroup::getNamedEntries(this);
            if ((pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                super__Vector_impl_data._M_finish !=
                (pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
            }
          }
          if ((d->mType == DT_Group) &&
             (pvVar6 = DataGroup::getNamedEntries(this), d->mType == DT_Group)) {
            d_00 = (pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                   super__Vector_impl_data._M_start;
            paVar2 = &local_90.mKey.field_2;
            goto LAB_00110980;
          }
          break;
        }
        if (d->mType != DT_Group) break;
        DataGroup::at(&local_90,this,uVar8);
        print_val(&local_90,stream);
        if (d->mType != DT_Group) break;
        sVar5 = DataGroup::anonymousCount(this);
        if (uVar8 != sVar5 - 1) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        }
        Data::~Data(&local_90);
        uVar8 = uVar8 + 1;
      } while (d->mType == DT_Group);
    }
    goto LAB_00110a40;
  case DT_Integer:
    std::ostream::_M_insert<long>((long)(stream + 0x10));
    return;
  case DT_Float:
    std::ostream::_M_insert<double>((double)(d->field_2).mFloat);
    return;
  case DT_Bool:
    pcVar9 = "false";
    if ((ulong)(d->field_2).mBool != 0) {
      pcVar9 = "true";
    }
    uVar8 = (ulong)(d->field_2).mBool ^ 5;
    break;
  case DT_String:
    paVar2 = &local_90.mKey.field_2;
    pcVar3 = (d->mString)._M_dataplus._M_p;
    local_90.mKey._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (d->mString)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(stream + 0x10),local_90.mKey._M_dataplus._M_p,
               local_90.mKey._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.mKey._M_dataplus._M_p != paVar2) {
      operator_delete(local_90.mKey._M_dataplus._M_p,local_90.mKey.field_2._M_allocated_capacity + 1
                     );
    }
    return;
  default:
    pcVar9 = "###UNKNOWN### ";
    uVar8 = 0xe;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(stream + 0x10),pcVar9,uVar8);
  return;
  while( true ) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    pcVar3 = (d_00->mKey)._M_dataplus._M_p;
    local_90.mKey._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (d_00->mKey)._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_90.mKey._M_dataplus._M_p,local_90.mKey._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.mKey._M_dataplus._M_p != paVar2) {
      operator_delete(local_90.mKey._M_dataplus._M_p,local_90.mKey.field_2._M_allocated_capacity + 1
                     );
    }
    print_val(d_00,stream);
    if (d->mType != DT_Group) break;
    pvVar6 = DataGroup::getNamedEntries(this);
    d_00 = d_00 + 1;
    if (d_00 != (pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    }
    if (d->mType != DT_Group) break;
LAB_00110980:
    pvVar6 = DataGroup::getNamedEntries(this);
    if (d_00 == (pvVar6->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
      if (d->mType == DT_Group) {
        bVar4 = DataGroup::isArray(this);
        if (bVar4) {
          pcVar9 = "]";
        }
        else {
          pcVar9 = ")";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar9,1);
        return;
      }
      break;
    }
  }
LAB_00110a40:
  __assert_fail("(mType == DT_Group)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PearCoding[P]DataLisp/src/Data.inl"
                ,0x3b,"const DataGroup &DL::Data::getGroup() const");
}

Assistant:

static void print_val(const Data& d, std::stringstream& stream)
{
	switch (d.type()) {
	case DT_Bool:
		stream << (d.getBool() ? "true" : "false");
		break;
	case DT_Integer:
		stream << d.getInt();
		break;
	case DT_Float:
		stream << d.getFloat();
		break;
	case DT_String:
		stream << d.getString();
		break;
	case DT_Group:
		if (d.getGroup().isArray())
			stream << "[";
		else
			stream << "(" << d.getGroup().id() << " ";

		for (size_t i = 0; i < d.getGroup().anonymousCount(); ++i) {
			Data x = d.getGroup().at(i);
			print_val(x, stream);

			if (i != d.getGroup().anonymousCount() - 1)
				stream << ", ";
		}

		if (d.getGroup().anonymousCount() > 0 && d.getGroup().getNamedEntries().size() > 0)
			stream << ", ";

		for (auto it = d.getGroup().getNamedEntries().begin();
			 it != d.getGroup().getNamedEntries().end();) {
			stream << ":" << it->key() << " ";
			print_val(*it, stream);

			it++;
			if (it != d.getGroup().getNamedEntries().end())
				stream << ", ";
		}

		if (d.getGroup().isArray())
			stream << "]";
		else
			stream << ")";

		break;
	default:
		stream << "###UNKNOWN### ";
		break;
	}
}